

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O1

_Bool map_load(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_object_t *pgVar1;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar2;
  long *plVar3;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar4;
  gravity_fiber_t *fiber;
  gravity_class_t **ppgVar5;
  gravity_class_t *pgVar6;
  _Bool _Var7;
  gravity_value_t key;
  gravity_value_t value;
  gravity_value_t key_00;
  gravity_value_t value_00;
  gravity_value_t value_01;
  char _buffer [4096];
  char local_1028 [4096];
  
  pgVar6 = args[1].isa;
  if (pgVar6 == (gravity_class_t *)0x0) {
    builtin_strncpy(local_1028,"Invalid map key.",0x11);
    fiber = gravity_vm_fiber(vm);
    gravity_fiber_seterror(fiber,local_1028);
    _Var7 = false;
    value.field_1.n = 0;
    value.isa = gravity_class_null;
    gravity_vm_setslot(vm,value,rindex);
  }
  else {
    pgVar1 = (args->field_1).p;
    aVar2 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)args[1].field_1.n;
    key.field_1.n = aVar2.n;
    key.isa = pgVar6;
    aVar4.p = gravity_class_lookup(gravity_class_map,key);
    if ((gravity_object_t *)aVar4.n == (gravity_object_t *)0x0) {
      key_00.field_1.n = aVar2.n;
      key_00.isa = pgVar6;
      ppgVar5 = &gravity_hash_lookup((gravity_hash_t *)pgVar1->objclass,key_00)->isa;
      if ((gravity_value_t *)ppgVar5 == (gravity_value_t *)0x0) {
        ppgVar5 = &gravity_class_null;
        aVar4.n = 0;
      }
      else {
        aVar4 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)
                (((gravity_value_t *)ppgVar5)->field_1).n;
      }
      pgVar6 = ((gravity_value_t *)ppgVar5)->isa;
    }
    else {
      pgVar6 = (aVar4.p)->isa;
      if ((((pgVar6 == gravity_class_closure) &&
           (plVar3 = (long *)(aVar4.p)->identifier, plVar3 != (long *)0x0)) &&
          ((gravity_class_t *)*plVar3 == gravity_class_function)) &&
         (((int)plVar3[9] == 3 &&
          (aVar2 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)
                   ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)(plVar3 + 0xb))->p,
          aVar2.n != 0)))) {
        value_00.field_1.p = (gravity_object_t *)aVar2.n;
        value_00.isa = (aVar2.p)->isa;
        gravity_vm_setslot(vm,value_00,rindex);
        return false;
      }
    }
    value_01.field_1.n = aVar4.n;
    value_01.isa = pgVar6;
    gravity_vm_setslot(vm,value_01,rindex);
    _Var7 = true;
  }
  return _Var7;
}

Assistant:

static bool map_load (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm, nargs)
    
    // called when a map is accessed with dot notation
    // for example:
    // var map = ["key1": 10];
    // return map.key1;
    // in this case (since we override object_load super) try to access
    // class first and if nothing is found access its internal hash table
    
    gravity_map_t *map = VALUE_AS_MAP(GET_VALUE(0));
    gravity_value_t key = GET_VALUE(1);
    if (VALUE_ISA_NOTVALID(key)) RETURN_ERROR("Invalid map key.");

    // check class first (so user will not be able to break anything)
    gravity_object_t *obj = (gravity_object_t *)gravity_class_lookup(gravity_class_map, key);
    if (obj) {
        if (OBJECT_ISA_CLOSURE(obj)) {
            gravity_closure_t *closure = (gravity_closure_t *)obj;
            if (closure && closure->f) {
                // execute optimized default getter
                if (FUNCTION_ISA_SPECIAL(closure->f)) {
                    if (FUNCTION_ISA_GETTER(closure->f)) {
                        // returns a function to be executed using the return false trick
                        RETURN_CLOSURE(VALUE_FROM_OBJECT((gravity_closure_t *)closure->f->special[EXEC_TYPE_SPECIAL_GETTER]), rindex);
                    }
                }
            }
        }
        RETURN_VALUE(VALUE_FROM_OBJECT(obj), rindex);
    }
    
    // then check its internal hash
    gravity_value_t *value = gravity_hash_lookup(map->hash, key);
    RETURN_VALUE((value) ? *value : VALUE_FROM_NULL, rindex);
}